

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedCollator::getSortKey
          (RuleBasedCollator *this,UChar *s,int32_t length,uint8_t *dest,int32_t capacity)

{
  UBool UVar1;
  int32_t local_8c;
  UErrorCode local_5c;
  undefined1 local_58 [4];
  UErrorCode errorCode;
  FixedSortKeyByteSink sink;
  uint8_t noDest [1];
  uint8_t *puStack_30;
  int32_t capacity_local;
  uint8_t *dest_local;
  int32_t length_local;
  UChar *s_local;
  RuleBasedCollator *this_local;
  
  if ((((s == (UChar *)0x0) && (length != 0)) || (capacity < 0)) ||
     ((dest == (uint8_t *)0x0 && (0 < capacity)))) {
    this_local._4_4_ = 0;
  }
  else {
    sink.super_SortKeyByteSink._28_4_ = capacity;
    memset((void *)((long)&sink.super_SortKeyByteSink.ignore_ + 3),0,1);
    puStack_30 = dest;
    if (dest == (uint8_t *)0x0) {
      puStack_30 = (uint8_t *)((long)&sink.super_SortKeyByteSink.ignore_ + 3);
      sink.super_SortKeyByteSink._28_4_ = 0;
    }
    anon_unknown_16::FixedSortKeyByteSink::FixedSortKeyByteSink
              ((FixedSortKeyByteSink *)local_58,(char *)puStack_30,sink.super_SortKeyByteSink._28_4_
              );
    local_5c = U_ZERO_ERROR;
    writeSortKey(this,s,length,(SortKeyByteSink *)local_58,&local_5c);
    UVar1 = ::U_SUCCESS(local_5c);
    if (UVar1 == '\0') {
      local_8c = 0;
    }
    else {
      local_8c = SortKeyByteSink::NumberOfBytesAppended((SortKeyByteSink *)local_58);
    }
    this_local._4_4_ = local_8c;
    anon_unknown_16::FixedSortKeyByteSink::~FixedSortKeyByteSink((FixedSortKeyByteSink *)local_58);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedCollator::getSortKey(const UChar *s, int32_t length,
                              uint8_t *dest, int32_t capacity) const {
    if((s == NULL && length != 0) || capacity < 0 || (dest == NULL && capacity > 0)) {
        return 0;
    }
    uint8_t noDest[1] = { 0 };
    if(dest == NULL) {
        // Distinguish pure preflighting from an allocation error.
        dest = noDest;
        capacity = 0;
    }
    FixedSortKeyByteSink sink(reinterpret_cast<char *>(dest), capacity);
    UErrorCode errorCode = U_ZERO_ERROR;
    writeSortKey(s, length, sink, errorCode);
    return U_SUCCESS(errorCode) ? sink.NumberOfBytesAppended() : 0;
}